

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

dirent * ixxx::posix::readdir(DIR *__dirp)

{
  int *piVar1;
  dirent *pdVar2;
  readdir_error *this;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  pdVar2 = ::readdir(__dirp);
  if (*piVar1 == 0) {
    return pdVar2;
  }
  this = (readdir_error *)__cxa_allocate_exception(0x20);
  readdir_error::sys_error(this,*piVar1,(char *)0x0,ERRNO);
  __cxa_throw(this,&readdir_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

struct dirent *readdir(DIR *dirp)
    {
      errno = 0;
      struct dirent *r = ::readdir(dirp);
      if (errno)
        throw readdir_error(errno);
      return r;
    }